

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

ExprBase *
CreateBinaryOp(ExpressionContext *ctx,SynBase *source,SynBinaryOpType op,ExprBase *lhs,ExprBase *rhs
              )

{
  IntrusiveList<TypeHandle> arguments;
  SynBase *pSVar1;
  SynBase *pSVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  ExprBase *pEVar7;
  TypeHandle *this;
  ExprTypeCast *pEVar8;
  TypeBase *pTVar9;
  TypeRef *pTVar10;
  SmallDenseSet<TypePair,_TypePairHasher,_4U> *pSVar11;
  TypeRef *pTVar12;
  ExpressionContext *pEVar13;
  char *pcVar14;
  bool local_219;
  ExprBase *result;
  TypeBase *resultType;
  TypeBase *commonType_1;
  TypeBase *commonType;
  undefined1 auStack_148 [5];
  bool logicalOp;
  bool comparisonOp;
  bool binaryOp;
  ExprBase *local_138;
  ExprBase *result_4;
  TypePair typePair;
  ExprBase *result_3;
  TypeClass *rhsTypeClass;
  TypeClass *lhsTypeClass;
  TypeRef *rhsTypeRef;
  TypeRef *lhsTypeRef;
  TypeBase *commonBaseClass;
  undefined1 auStack_d8 [7];
  bool hasBuiltIn;
  undefined8 local_c8;
  ExprBase *result_2;
  InplaceStr local_b0;
  ExprBase *local_a0;
  ExprBase *result_1;
  TypeBase *local_88;
  TypeHandle *local_80;
  TypeFunction *local_78;
  TypeBase *type;
  IntrusiveList<TypeHandle> types;
  undefined1 auStack_48 [7];
  bool skipOverload;
  ExprTypeCast *local_38;
  ExprBase *rhs_local;
  ExprBase *lhs_local;
  SynBase *pSStack_20;
  SynBinaryOpType op_local;
  SynBase *source_local;
  ExpressionContext *ctx_local;
  
  local_38 = (ExprTypeCast *)rhs;
  rhs_local = lhs;
  lhs_local._4_4_ = op;
  pSStack_20 = source;
  source_local = (SynBase *)ctx;
  bVar3 = isType<TypeError>(lhs->type);
  if ((bVar3) ||
     (bVar3 = isType<TypeError>(*(TypeBase **)((long)local_38 + 0x18)), pSVar2 = source_local,
     pSVar1 = pSStack_20, bVar3)) {
    pEVar13 = (ExpressionContext *)
              ExpressionContext::get<ExprBinaryOp>((ExpressionContext *)source_local);
    pSVar1 = pSStack_20;
    pTVar9 = &ExpressionContext::GetErrorType((ExpressionContext *)source_local)->super_TypeBase;
    ExprBinaryOp::ExprBinaryOp
              ((ExprBinaryOp *)pEVar13,pSVar1,pTVar9,lhs_local._4_4_,rhs_local,
               &local_38->super_ExprBase);
    ctx_local = pEVar13;
  }
  else if (lhs_local._4_4_ == SYN_BINARY_OP_IN) {
    InplaceStr::InplaceStr((InplaceStr *)auStack_48,"in");
    ctx_local = (ExpressionContext *)
                CreateFunctionCall2((ExpressionContext *)pSVar2,pSVar1,_auStack_48,rhs_local,
                                    &local_38->super_ExprBase,false,false,false);
  }
  else {
    bVar3 = false;
    if ((lhs_local._4_4_ == SYN_BINARY_OP_EQUAL) || (lhs_local._4_4_ == SYN_BINARY_OP_NOT_EQUAL)) {
      if (rhs_local->type != *(TypeBase **)((long)local_38 + 0x18)) {
        if (rhs_local->type == *(TypeBase **)&source_local[0x228].typeID) {
          rhs_local = CreateCast((ExpressionContext *)source_local,pSStack_20,rhs_local,
                                 *(TypeBase **)((long)local_38 + 0x18),false);
        }
        if (*(TypeBase **)((long)local_38 + 0x18) == *(TypeBase **)&source_local[0x228].typeID) {
          local_38 = (ExprTypeCast *)
                     CreateCast((ExpressionContext *)source_local,pSStack_20,
                                &local_38->super_ExprBase,rhs_local->type,false);
        }
      }
      pSVar2 = source_local;
      pSVar1 = pSStack_20;
      if ((rhs_local->type == (TypeBase *)source_local[0x228].pos.begin) &&
         (rhs_local->type == *(TypeBase **)((long)local_38 + 0x18))) {
        pcVar14 = "__rncomp";
        if (lhs_local._4_4_ == SYN_BINARY_OP_EQUAL) {
          pcVar14 = "__rcomp";
        }
        InplaceStr::InplaceStr((InplaceStr *)&types.tail,pcVar14);
        pEVar7 = CreateFunctionCall2((ExpressionContext *)pSVar2,pSVar1,stack0xffffffffffffffa0,
                                     rhs_local,&local_38->super_ExprBase,false,true,true);
        return pEVar7;
      }
      bVar4 = isType<TypeFunction>(rhs_local->type);
      if ((bVar4) && (rhs_local->type == *(TypeBase **)((long)local_38 + 0x18))) {
        IntrusiveList<TypeHandle>::IntrusiveList((IntrusiveList<TypeHandle> *)&type);
        this = ExpressionContext::get<TypeHandle>((ExpressionContext *)source_local);
        TypeHandle::TypeHandle(this,(TypeBase *)source_local[0x227].end);
        IntrusiveList<TypeHandle>::push_back((IntrusiveList<TypeHandle> *)&type,this);
        local_88 = type;
        local_80 = types.head;
        arguments.tail = types.head;
        arguments.head = (TypeHandle *)type;
        local_78 = ExpressionContext::GetFunctionType
                             ((ExpressionContext *)source_local,pSStack_20,
                              *(TypeBase **)&source_local[0x226].listed,arguments);
        pEVar8 = ExpressionContext::get<ExprTypeCast>((ExpressionContext *)source_local);
        ExprTypeCast::ExprTypeCast
                  (pEVar8,rhs_local->source,&local_78->super_TypeBase,rhs_local,
                   EXPR_CAST_REINTERPRET);
        rhs_local = &pEVar8->super_ExprBase;
        pEVar8 = ExpressionContext::get<ExprTypeCast>((ExpressionContext *)source_local);
        ExprTypeCast::ExprTypeCast
                  (pEVar8,*(SynBase **)((long)local_38 + 0x10),&local_78->super_TypeBase,
                   &local_38->super_ExprBase,EXPR_CAST_REINTERPRET);
        pSVar2 = source_local;
        pSVar1 = pSStack_20;
        pcVar14 = "__pncomp";
        if (lhs_local._4_4_ == SYN_BINARY_OP_EQUAL) {
          pcVar14 = "__pcomp";
        }
        local_38 = pEVar8;
        InplaceStr::InplaceStr((InplaceStr *)&result_1,pcVar14);
        pEVar7 = CreateFunctionCall2((ExpressionContext *)pSVar2,pSVar1,_result_1,rhs_local,
                                     &local_38->super_ExprBase,false,true,true);
        return pEVar7;
      }
      bVar4 = isType<TypeUnsizedArray>(rhs_local->type);
      pSVar2 = source_local;
      pSVar1 = pSStack_20;
      if ((bVar4) && (rhs_local->type == *(TypeBase **)((long)local_38 + 0x18))) {
        pcVar14 = GetOpName(lhs_local._4_4_);
        InplaceStr::InplaceStr(&local_b0,pcVar14);
        local_a0 = CreateFunctionCall2((ExpressionContext *)pSVar2,pSVar1,local_b0,rhs_local,
                                       &local_38->super_ExprBase,true,false,true);
        pSVar2 = source_local;
        pSVar1 = pSStack_20;
        if (local_a0 != (ExprBase *)0x0) {
          return local_a0;
        }
        pcVar14 = "__ancomp";
        if (lhs_local._4_4_ == SYN_BINARY_OP_EQUAL) {
          pcVar14 = "__acomp";
        }
        InplaceStr::InplaceStr((InplaceStr *)&result_2,pcVar14);
        pEVar7 = CreateFunctionCall2((ExpressionContext *)pSVar2,pSVar1,_result_2,rhs_local,
                                     &local_38->super_ExprBase,false,true,true);
        return pEVar7;
      }
      if ((rhs_local->type == *(TypeBase **)&source_local[0x227].listed) &&
         (*(TypeBase **)((long)local_38 + 0x18) == *(TypeBase **)&source_local[0x227].listed)) {
        bVar3 = true;
      }
    }
    if (((!bVar3) && (lhs_local._4_4_ == SYN_BINARY_OP_LOGICAL_XOR)) &&
       (bVar4 = isType<TypeClass>(rhs_local->type), pSVar2 = source_local, pSVar1 = pSStack_20,
       bVar4)) {
      pcVar14 = GetOpName(lhs_local._4_4_);
      InplaceStr::InplaceStr((InplaceStr *)auStack_d8,pcVar14);
      pEVar7 = CreateFunctionCall2((ExpressionContext *)pSVar2,pSVar1,_auStack_d8,rhs_local,
                                   &local_38->super_ExprBase,true,false,true);
      if (pEVar7 != (ExprBase *)0x0) {
        return pEVar7;
      }
      local_c8 = 0;
    }
    if (((lhs_local._4_4_ == SYN_BINARY_OP_LOGICAL_AND) ||
        (lhs_local._4_4_ == SYN_BINARY_OP_LOGICAL_OR)) ||
       (lhs_local._4_4_ == SYN_BINARY_OP_LOGICAL_XOR)) {
      rhs_local = CreateConditionCast((ExpressionContext *)source_local,rhs_local->source,rhs_local)
      ;
      local_38 = (ExprTypeCast *)
                 CreateConditionCast((ExpressionContext *)source_local,
                                     *(SynBase **)((long)local_38 + 0x10),&local_38->super_ExprBase)
      ;
    }
    pSVar2 = source_local;
    pSVar1 = pSStack_20;
    if (rhs_local->type == *(TypeBase **)&source_local[0x226].listed) {
      pTVar9 = &ExpressionContext::GetErrorType((ExpressionContext *)source_local)->super_TypeBase;
      ctx_local = (ExpressionContext *)
                  anon_unknown.dwarf_8df1c::ReportExpected
                            ((ExpressionContext *)pSVar2,pSVar1,pTVar9,
                             "ERROR: first operand type is \'void\'");
    }
    else if (*(TypeBase **)((long)local_38 + 0x18) == *(TypeBase **)&source_local[0x226].listed) {
      pTVar9 = &ExpressionContext::GetErrorType((ExpressionContext *)source_local)->super_TypeBase;
      ctx_local = (ExpressionContext *)
                  anon_unknown.dwarf_8df1c::ReportExpected
                            ((ExpressionContext *)pSVar2,pSVar1,pTVar9,
                             "ERROR: second operand type is \'void\'");
    }
    else {
      bVar4 = ExpressionContext::IsNumericType((ExpressionContext *)source_local,rhs_local->type);
      local_219 = false;
      if (bVar4) {
        local_219 = ExpressionContext::IsNumericType
                              ((ExpressionContext *)source_local,
                               *(TypeBase **)((long)local_38 + 0x18));
      }
      bVar5 = isType<TypeEnum>(rhs_local->type);
      bVar4 = false;
      if (bVar5) {
        bVar4 = rhs_local->type == *(TypeBase **)((long)local_38 + 0x18);
      }
      bVar4 = local_219 != false || bVar4;
      lhsTypeRef = (TypeRef *)0x0;
      if ((lhs_local._4_4_ == SYN_BINARY_OP_EQUAL) || (lhs_local._4_4_ == SYN_BINARY_OP_NOT_EQUAL))
      {
        if ((rhs_local->type == *(TypeBase **)&source_local[0x227].listed) &&
           (*(TypeBase **)((long)local_38 + 0x18) == *(TypeBase **)&source_local[0x227].listed)) {
          bVar4 = true;
        }
        bVar5 = isType<TypeRef>(rhs_local->type);
        if ((bVar5) && (bVar5 = isType<TypeRef>(*(TypeBase **)((long)local_38 + 0x18)), bVar5)) {
          pTVar12 = getType<TypeRef>(rhs_local->type);
          pTVar10 = getType<TypeRef>(*(TypeBase **)((long)local_38 + 0x18));
          if (rhs_local->type == *(TypeBase **)((long)local_38 + 0x18)) {
            bVar4 = true;
          }
          else {
            bVar5 = isType<TypeClass>(pTVar12->subType);
            if ((bVar5) && (bVar5 = isType<TypeClass>(pTVar10->subType), bVar5)) {
              rhsTypeClass = getType<TypeClass>(pTVar12->subType);
              result_3 = (ExprBase *)getType<TypeClass>(pTVar10->subType);
              for (; rhsTypeClass->baseClass != (TypeClass *)0x0;
                  rhsTypeClass = rhsTypeClass->baseClass) {
              }
              for (; *(long *)&result_3[5].listed != 0; result_3 = *(ExprBase **)&result_3[5].listed
                  ) {
              }
              if (rhsTypeClass == (TypeClass *)result_3) {
                bVar4 = true;
                lhsTypeRef = (TypeRef *)rhsTypeClass;
              }
            }
          }
        }
      }
      pSVar2 = source_local;
      pSVar1 = pSStack_20;
      if (!bVar3) {
        if (bVar4) {
          TypePair::TypePair((TypePair *)&result_4,rhs_local->type,
                             *(TypeBase **)((long)local_38 + 0x18));
          pSVar11 = FixedArray<SmallDenseSet<TypePair,_TypePairHasher,_4U>,_21U>::operator[]
                              ((FixedArray<SmallDenseSet<TypePair,_TypePairHasher,_4U>,_21U> *)
                               &source_local[0x1c8].listed,lhs_local._4_4_ - SYN_BINARY_OP_ADD);
          bVar3 = SmallDenseSet<TypePair,_TypePairHasher,_4U>::contains
                            (pSVar11,(TypePair *)&result_4);
          pSVar2 = source_local;
          pSVar1 = pSStack_20;
          if (!bVar3) {
            pcVar14 = GetOpName(lhs_local._4_4_);
            InplaceStr::InplaceStr((InplaceStr *)auStack_148,pcVar14);
            local_138 = CreateFunctionCall2((ExpressionContext *)pSVar2,pSVar1,_auStack_148,
                                            rhs_local,&local_38->super_ExprBase,true,false,true);
            if (local_138 != (ExprBase *)0x0) {
              return local_138;
            }
            pSVar11 = FixedArray<SmallDenseSet<TypePair,_TypePairHasher,_4U>,_21U>::operator[]
                                ((FixedArray<SmallDenseSet<TypePair,_TypePairHasher,_4U>,_21U> *)
                                 &source_local[0x1c8].listed,lhs_local._4_4_ - SYN_BINARY_OP_ADD);
            SmallDenseSet<TypePair,_TypePairHasher,_4U>::insert(pSVar11,(TypePair *)&result_4);
          }
        }
        else {
          pcVar14 = GetOpName(lhs_local._4_4_);
          InplaceStr::InplaceStr((InplaceStr *)&typePair.b,pcVar14);
          pEVar7 = CreateFunctionCall2((ExpressionContext *)pSVar2,pSVar1,stack0xfffffffffffffee0,
                                       rhs_local,&local_38->super_ExprBase,false,false,true);
          if (pEVar7 != (ExprBase *)0x0) {
            return pEVar7;
          }
        }
      }
      AssertValueExpression((ExpressionContext *)source_local,rhs_local->source,rhs_local);
      AssertValueExpression
                ((ExpressionContext *)source_local,*(SynBase **)((long)local_38 + 0x10),
                 &local_38->super_ExprBase);
      pSVar2 = source_local;
      pSVar1 = pSStack_20;
      if (bVar4) {
        bVar3 = anon_unknown.dwarf_8df1c::IsBinaryOp(lhs_local._4_4_);
        bVar4 = anon_unknown.dwarf_8df1c::IsComparisonOp(lhs_local._4_4_);
        bVar5 = anon_unknown.dwarf_8df1c::IsLogicalOp(lhs_local._4_4_);
        bVar6 = ExpressionContext::IsFloatingPointType
                          ((ExpressionContext *)source_local,rhs_local->type);
        if (((bVar6) ||
            (bVar6 = ExpressionContext::IsFloatingPointType
                               ((ExpressionContext *)source_local,
                                *(TypeBase **)((long)local_38 + 0x18)), bVar6)) &&
           ((pSVar2 = source_local, pSVar1 = pSStack_20, bVar5 || (bVar3)))) {
          pTVar9 = rhs_local->type;
          pcVar14 = GetOpName(lhs_local._4_4_);
          ctx_local = (ExpressionContext *)
                      anon_unknown.dwarf_8df1c::ReportExpected
                                ((ExpressionContext *)pSVar2,pSVar1,pTVar9,
                                 "ERROR: operation %s is not supported on \'%.*s\' and \'%.*s\'",
                                 pcVar14,(ulong)(uint)((int)(rhs_local->type->name).end -
                                                      (int)(rhs_local->type->name).begin),
                                 (rhs_local->type->name).begin,
                                 (int)((*(TypeBase **)((long)local_38 + 0x18))->name).end -
                                 (int)((*(TypeBase **)((long)local_38 + 0x18))->name).begin,
                                 ((*(TypeBase **)((long)local_38 + 0x18))->name).begin);
        }
        else {
          if (bVar5) {
            rhs_local = CreateCast((ExpressionContext *)source_local,pSStack_20,rhs_local,
                                   (TypeBase *)source_local[0x227]._vptr_SynBase,false);
            local_38 = (ExprTypeCast *)
                       CreateCast((ExpressionContext *)source_local,pSStack_20,
                                  &local_38->super_ExprBase,
                                  (TypeBase *)source_local[0x227]._vptr_SynBase,false);
          }
          else {
            bVar6 = ExpressionContext::IsNumericType
                              ((ExpressionContext *)source_local,rhs_local->type);
            if ((bVar6) &&
               (bVar6 = ExpressionContext::IsNumericType
                                  ((ExpressionContext *)source_local,
                                   *(TypeBase **)((long)local_38 + 0x18)), bVar6)) {
              pTVar9 = ExpressionContext::GetBinaryOpResultType
                                 ((ExpressionContext *)source_local,rhs_local->type,
                                  *(TypeBase **)((long)local_38 + 0x18));
              rhs_local = CreateCast((ExpressionContext *)source_local,pSStack_20,rhs_local,pTVar9,
                                     false);
              local_38 = (ExprTypeCast *)
                         CreateCast((ExpressionContext *)source_local,pSStack_20,
                                    &local_38->super_ExprBase,pTVar9,false);
            }
            else if (lhsTypeRef != (TypeRef *)0x0) {
              pTVar12 = ExpressionContext::GetReferenceType
                                  ((ExpressionContext *)source_local,&lhsTypeRef->super_TypeBase);
              rhs_local = CreateCast((ExpressionContext *)source_local,pSStack_20,rhs_local,
                                     &pTVar12->super_TypeBase,false);
              local_38 = (ExprTypeCast *)
                         CreateCast((ExpressionContext *)source_local,pSStack_20,
                                    &local_38->super_ExprBase,&pTVar12->super_TypeBase,false);
            }
          }
          pSVar2 = source_local;
          pSVar1 = pSStack_20;
          if (rhs_local->type == *(TypeBase **)((long)local_38 + 0x18)) {
            if ((bVar4) || (bVar5)) {
              result = (ExprBase *)source_local[0x227]._vptr_SynBase;
            }
            else {
              result = (ExprBase *)rhs_local->type;
            }
            pEVar13 = (ExpressionContext *)
                      ExpressionContext::get<ExprBinaryOp>((ExpressionContext *)source_local);
            ExprBinaryOp::ExprBinaryOp
                      ((ExprBinaryOp *)pEVar13,pSStack_20,(TypeBase *)result,lhs_local._4_4_,
                       rhs_local,&local_38->super_ExprBase);
            ctx_local = pEVar13;
            if ((((rhs_local->type == (TypeBase *)source_local[0x227]._vptr_SynBase) && (!bVar3)) &&
                (!bVar4)) && (!bVar5)) {
              ctx_local = (ExpressionContext *)
                          CreateCast((ExpressionContext *)source_local,pSStack_20,
                                     (ExprBase *)pEVar13,(TypeBase *)source_local[0x227].end,false);
            }
          }
          else {
            pTVar9 = rhs_local->type;
            pcVar14 = GetOpName(lhs_local._4_4_);
            ctx_local = (ExpressionContext *)
                        anon_unknown.dwarf_8df1c::ReportExpected
                                  ((ExpressionContext *)pSVar2,pSVar1,pTVar9,
                                   "ERROR: operation %s is not supported on \'%.*s\' and \'%.*s\'",
                                   pcVar14,(ulong)(uint)((int)(rhs_local->type->name).end -
                                                        (int)(rhs_local->type->name).begin),
                                   (rhs_local->type->name).begin,
                                   (int)((*(TypeBase **)((long)local_38 + 0x18))->name).end -
                                   (int)((*(TypeBase **)((long)local_38 + 0x18))->name).begin,
                                   ((*(TypeBase **)((long)local_38 + 0x18))->name).begin);
          }
        }
      }
      else {
        pTVar9 = rhs_local->type;
        pcVar14 = GetOpName(lhs_local._4_4_);
        ctx_local = (ExpressionContext *)
                    anon_unknown.dwarf_8df1c::ReportExpected
                              ((ExpressionContext *)pSVar2,pSVar1,pTVar9,
                               "ERROR: operation %s is not supported on \'%.*s\' and \'%.*s\'",
                               pcVar14,(ulong)(uint)((int)(rhs_local->type->name).end -
                                                    (int)(rhs_local->type->name).begin),
                               (rhs_local->type->name).begin,
                               (int)((*(TypeBase **)((long)local_38 + 0x18))->name).end -
                               (int)((*(TypeBase **)((long)local_38 + 0x18))->name).begin,
                               ((*(TypeBase **)((long)local_38 + 0x18))->name).begin);
      }
    }
  }
  return (ExprBase *)ctx_local;
}

Assistant:

ExprBase* CreateBinaryOp(ExpressionContext &ctx, SynBase *source, SynBinaryOpType op, ExprBase *lhs, ExprBase *rhs)
{
	if(isType<TypeError>(lhs->type) || isType<TypeError>(rhs->type))
		return new (ctx.get<ExprBinaryOp>()) ExprBinaryOp(source, ctx.GetErrorType(), op, lhs, rhs);

	if(op == SYN_BINARY_OP_IN)
		return CreateFunctionCall2(ctx, source, InplaceStr("in"), lhs, rhs, false, false, false);

	bool skipOverload = false;

	// Built-in comparisons
	if(op == SYN_BINARY_OP_EQUAL || op == SYN_BINARY_OP_NOT_EQUAL)
	{
		if(lhs->type != rhs->type)
		{
			if(lhs->type == ctx.typeNullPtr)
				lhs = CreateCast(ctx, source, lhs, rhs->type, false);

			if(rhs->type == ctx.typeNullPtr)
				rhs = CreateCast(ctx, source, rhs, lhs->type, false);
		}

		if(lhs->type == ctx.typeAutoRef && lhs->type == rhs->type)
		{
			return CreateFunctionCall2(ctx, source, InplaceStr(op == SYN_BINARY_OP_EQUAL ? "__rcomp" : "__rncomp"), lhs, rhs, false, true, true);
		}

		if(isType<TypeFunction>(lhs->type) && lhs->type == rhs->type)
		{
			IntrusiveList<TypeHandle> types;
			types.push_back(new (ctx.get<TypeHandle>()) TypeHandle(ctx.typeInt));
			TypeBase *type = ctx.GetFunctionType(source, ctx.typeVoid, types);

			lhs = new (ctx.get<ExprTypeCast>()) ExprTypeCast(lhs->source, type, lhs, EXPR_CAST_REINTERPRET);
			rhs = new (ctx.get<ExprTypeCast>()) ExprTypeCast(rhs->source, type, rhs, EXPR_CAST_REINTERPRET);

			return CreateFunctionCall2(ctx, source, InplaceStr(op == SYN_BINARY_OP_EQUAL ? "__pcomp" : "__pncomp"), lhs, rhs, false, true, true);
		}

		if(isType<TypeUnsizedArray>(lhs->type) && lhs->type == rhs->type)
		{
			if(ExprBase *result = CreateFunctionCall2(ctx, source, InplaceStr(GetOpName(op)), lhs, rhs, true, false, true))
				return result;

			return CreateFunctionCall2(ctx, source, InplaceStr(op == SYN_BINARY_OP_EQUAL ? "__acomp" : "__ancomp"), lhs, rhs, false, true, true);
		}

		if(lhs->type == ctx.typeTypeID && rhs->type == ctx.typeTypeID)
			skipOverload = true;
	}

	if(!skipOverload)
	{
		// For ^^ try to find a function before generic condition casts to bool
		if(op == SYN_BINARY_OP_LOGICAL_XOR && isType<TypeClass>(lhs->type))
		{
			if(ExprBase *result = CreateFunctionCall2(ctx, source, InplaceStr(GetOpName(op)), lhs, rhs, true, false, true))
				return result;
		}
	}

	// Promotion to bool for some types
	if(op == SYN_BINARY_OP_LOGICAL_AND || op == SYN_BINARY_OP_LOGICAL_OR || op == SYN_BINARY_OP_LOGICAL_XOR)
	{
		lhs = CreateConditionCast(ctx, lhs->source, lhs);
		rhs = CreateConditionCast(ctx, rhs->source, rhs);
	}

	if(lhs->type == ctx.typeVoid)
		return ReportExpected(ctx, source, ctx.GetErrorType(), "ERROR: first operand type is 'void'");

	if(rhs->type == ctx.typeVoid)
		return ReportExpected(ctx, source, ctx.GetErrorType(), "ERROR: second operand type is 'void'");

	bool hasBuiltIn = false;

	hasBuiltIn |= ctx.IsNumericType(lhs->type) && ctx.IsNumericType(rhs->type);
	hasBuiltIn |= isType<TypeEnum>(lhs->type) && lhs->type == rhs->type;

	TypeBase *commonBaseClass = NULL;

	if(op == SYN_BINARY_OP_EQUAL || op == SYN_BINARY_OP_NOT_EQUAL)
	{
		if(lhs->type == ctx.typeTypeID && rhs->type == ctx.typeTypeID)
			hasBuiltIn = true;

		if(isType<TypeRef>(lhs->type) && isType<TypeRef>(rhs->type))
		{
			TypeRef *lhsTypeRef = getType<TypeRef>(lhs->type);
			TypeRef *rhsTypeRef = getType<TypeRef>(rhs->type);

			if(lhs->type == rhs->type)
			{
				hasBuiltIn = true;
			}
			else if(isType<TypeClass>(lhsTypeRef->subType) && isType<TypeClass>(rhsTypeRef->subType))
			{
				TypeClass *lhsTypeClass = getType<TypeClass>(lhsTypeRef->subType);
				TypeClass *rhsTypeClass = getType<TypeClass>(rhsTypeRef->subType);

				while(lhsTypeClass->baseClass)
					lhsTypeClass = lhsTypeClass->baseClass;

				while(rhsTypeClass->baseClass)
					rhsTypeClass = rhsTypeClass->baseClass;

				if(lhsTypeClass == rhsTypeClass)
				{
					hasBuiltIn = true;

					commonBaseClass = lhsTypeClass;
				}
			}
		}
	}

	if(!skipOverload)
	{
		if(!hasBuiltIn)
		{
			if(ExprBase *result = CreateFunctionCall2(ctx, source, InplaceStr(GetOpName(op)), lhs, rhs, false, false, true))
				return result;
		}
		else
		{
			TypePair typePair(lhs->type, rhs->type);

			if(!ctx.noBinaryOperatorForTypePair[int(op) - 1].contains(typePair))
			{
				if(ExprBase *result = CreateFunctionCall2(ctx, source, InplaceStr(GetOpName(op)), lhs, rhs, true, false, true))
					return result;
				else
					ctx.noBinaryOperatorForTypePair[int(op) - 1].insert(typePair);
			}
		}
	}

	AssertValueExpression(ctx, lhs->source, lhs);
	AssertValueExpression(ctx, rhs->source, rhs);

	if(!hasBuiltIn)
		return ReportExpected(ctx, source, lhs->type, "ERROR: operation %s is not supported on '%.*s' and '%.*s'", GetOpName(op), FMT_ISTR(lhs->type->name), FMT_ISTR(rhs->type->name));

	bool binaryOp = IsBinaryOp(op);
	bool comparisonOp = IsComparisonOp(op);
	bool logicalOp = IsLogicalOp(op);

	if(ctx.IsFloatingPointType(lhs->type) || ctx.IsFloatingPointType(rhs->type))
	{
		if(logicalOp || binaryOp)
			return ReportExpected(ctx, source, lhs->type, "ERROR: operation %s is not supported on '%.*s' and '%.*s'", GetOpName(op), FMT_ISTR(lhs->type->name), FMT_ISTR(rhs->type->name));
	}

	if(logicalOp)
	{
		// Logical operations require both operands to be 'bool'
		lhs = CreateCast(ctx, source, lhs, ctx.typeBool, false);
		rhs = CreateCast(ctx, source, rhs, ctx.typeBool, false);
	}
	else if(ctx.IsNumericType(lhs->type) && ctx.IsNumericType(rhs->type))
	{
		// Numeric operations promote both operands to a common type
		TypeBase *commonType = ctx.GetBinaryOpResultType(lhs->type, rhs->type);

		lhs = CreateCast(ctx, source, lhs, commonType, false);
		rhs = CreateCast(ctx, source, rhs, commonType, false);
	}
	else if(commonBaseClass)
	{
		TypeBase *commonType = ctx.GetReferenceType(commonBaseClass);

		lhs = CreateCast(ctx, source, lhs, commonType, false);
		rhs = CreateCast(ctx, source, rhs, commonType, false);
	}

	if(lhs->type != rhs->type)
		return ReportExpected(ctx, source, lhs->type, "ERROR: operation %s is not supported on '%.*s' and '%.*s'", GetOpName(op), FMT_ISTR(lhs->type->name), FMT_ISTR(rhs->type->name));

	TypeBase *resultType = NULL;

	if(comparisonOp || logicalOp)
		resultType = ctx.typeBool;
	else
		resultType = lhs->type;

	ExprBase *result = new (ctx.get<ExprBinaryOp>()) ExprBinaryOp(source, resultType, op, lhs, rhs);

	// Arithmetic operation on bool results in an int
	if(lhs->type == ctx.typeBool && !binaryOp && !comparisonOp && !logicalOp)
		return CreateCast(ctx, source, result, ctx.typeInt, false);

	return result;
}